

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O0

void __thiscall string_view_operator_bracket_Test::TestBody(string_view_operator_bracket_Test *this)

{
  bool bVar1;
  const_reference pcVar2;
  char *pcVar3;
  AssertHelper local_f0;
  Message local_e8;
  char local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  Message local_c0;
  char local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_3;
  Message local_98;
  char local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  char local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_48;
  Message local_40;
  char local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  string_view sv;
  string_view_operator_bracket_Test *this_local;
  
  wabt::string_view::string_view((string_view *)&gtest_ar.message_,"words");
  local_31 = 'w';
  pcVar2 = wabt::string_view::operator[]((string_view *)&gtest_ar.message_,0);
  testing::internal::EqHelper<false>::Compare<char,char>
            ((EqHelper<false> *)local_30,"\'w\'","sv[0]",&local_31,pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(&local_40);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_61 = 'o';
    pcVar2 = wabt::string_view::operator[]((string_view *)&gtest_ar.message_,1);
    testing::internal::EqHelper<false>::Compare<char,char>
              ((EqHelper<false> *)local_60,"\'o\'","sv[1]",&local_61,pcVar2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_70);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                 ,0x98,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_70);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_89 = 'r';
      pcVar2 = wabt::string_view::operator[]((string_view *)&gtest_ar.message_,2);
      testing::internal::EqHelper<false>::Compare<char,char>
                ((EqHelper<false> *)local_88,"\'r\'","sv[2]",&local_89,pcVar2);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
      if (!bVar1) {
        testing::Message::Message(&local_98);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                   ,0x99,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_98);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_98);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_b1 = 'd';
        pcVar2 = wabt::string_view::operator[]((string_view *)&gtest_ar.message_,3);
        testing::internal::EqHelper<false>::Compare<char,char>
                  ((EqHelper<false> *)local_b0,"\'d\'","sv[3]",&local_b1,pcVar2);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
        if (!bVar1) {
          testing::Message::Message(&local_c0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                     ,0x9a,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c0)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_c0);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          local_d9 = 's';
          pcVar2 = wabt::string_view::operator[]((string_view *)&gtest_ar.message_,4);
          testing::internal::EqHelper<false>::Compare<char,char>
                    ((EqHelper<false> *)local_d8,"\'s\'","sv[4]",&local_d9,pcVar2);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
          if (!bVar1) {
            testing::Message::Message(&local_e8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                       ,0x9b,pcVar3);
            testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
            testing::internal::AssertHelper::~AssertHelper(&local_f0);
            testing::Message::~Message(&local_e8);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(string_view, operator_bracket) {
  string_view sv("words");
  ASSERT_EQ('w', sv[0]);
  ASSERT_EQ('o', sv[1]);
  ASSERT_EQ('r', sv[2]);
  ASSERT_EQ('d', sv[3]);
  ASSERT_EQ('s', sv[4]);
}